

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::JsonUnitTestResultPrinter::EscapeJson
                   (string *__return_storage_ptr__,string *str)

{
  byte bVar1;
  Message MVar2;
  uchar value;
  ostream *poVar3;
  char *pcVar4;
  size_t i;
  ulong uVar5;
  Message m;
  string local_50;
  
  Message::Message(&m);
  uVar5 = 0;
  do {
    MVar2.ss_.ptr_ = m.ss_.ptr_;
    if (str->_M_string_length <= uVar5) {
      StringStreamToString(__return_storage_ptr__,(stringstream *)m.ss_.ptr_);
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&m.ss_);
      return __return_storage_ptr__;
    }
    bVar1 = (str->_M_dataplus)._M_p[uVar5];
    switch(bVar1) {
    case 8:
      pcVar4 = "\\b";
      break;
    case 9:
      pcVar4 = "\\t";
      break;
    case 10:
      pcVar4 = "\\n";
      break;
    case 0xb:
switchD_0012f6c2_caseD_b:
      poVar3 = (ostream *)((long)m.ss_.ptr_ + 0x10);
      if ('\x1f' < (char)bVar1) goto LAB_0012f706;
      std::operator<<(poVar3,"\\u00");
      String::FormatByte_abi_cxx11_(&local_50,(String *)(ulong)bVar1,value);
      std::operator<<(poVar3,(string *)&local_50);
      std::__cxx11::string::_M_dispose();
      goto LAB_0012f7a2;
    case 0xc:
      pcVar4 = "\\f";
      break;
    case 0xd:
      pcVar4 = "\\r";
      break;
    default:
      if ((0x3a < bVar1 - 0x22) || ((0x400000000002001U >> ((ulong)(bVar1 - 0x22) & 0x3f) & 1) == 0)
         ) goto switchD_0012f6c2_caseD_b;
      std::operator<<((ostream *)((long)m.ss_.ptr_ + 0x10),'\\');
LAB_0012f706:
      std::operator<<((ostream *)((long)MVar2.ss_.ptr_ + 0x10),bVar1);
      goto LAB_0012f7a2;
    }
    std::operator<<((ostream *)((long)m.ss_.ptr_ + 0x10),pcVar4);
LAB_0012f7a2:
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

std::string JsonUnitTestResultPrinter::EscapeJson(const std::string& str) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '\\':
      case '"':
      case '/':
        m << '\\' << ch;
        break;
      case '\b':
        m << "\\b";
        break;
      case '\t':
        m << "\\t";
        break;
      case '\n':
        m << "\\n";
        break;
      case '\f':
        m << "\\f";
        break;
      case '\r':
        m << "\\r";
        break;
      default:
        if (ch < ' ') {
          m << "\\u00" << String::FormatByte(static_cast<unsigned char>(ch));
        } else {
          m << ch;
        }
        break;
    }
  }

  return m.GetString();
}